

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletocsv.cpp
# Opt level: O0

void ensembletocsv::doit(void)

{
  size_t local_18;
  size_t i;
  Ensemble q;
  
  printf("sidx, ensemble_id\n");
  local_18 = fread(&i,8,1,_stdin);
  while (local_18 != 0) {
    printf("%d, %d\n",(ulong)(uint)i,(ulong)i._4_4_);
    local_18 = fread(&i,8,1,_stdin);
  }
  return;
}

Assistant:

void doit() {

    printf("sidx, ensemble_id\n");

    Ensemble q;
    size_t i = fread(&q, sizeof(q), 1, stdin);
    while (i != 0) {
      printf("%d, %d\n", q.sidx, q.ensemble_id);
      i = fread(&q, sizeof(q), 1, stdin);
    }

  }